

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O2

void tcu::astc::anon_unknown_0::encodeISE
               (BitAssignAccessStream *dst,ISEParams *params,ISEInput *input,int numValues)

{
  undefined8 *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  anon_union_1536_2_f6fb8abe_for_value *paVar5;
  uint uVar6;
  uint *puVar7;
  ulong uVar8;
  ISEInput *pIVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  deUint32 dVar13;
  anon_union_1536_2_f6fb8abe_for_value *paVar14;
  ulong uVar15;
  bool bVar16;
  deUint32 local_b8 [8];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  deUint32 quintParts [3];
  uint local_6c;
  uint local_68;
  
  if (params->mode == ISEMODE_TRIT) {
    uVar4 = (numValues / 5 + 1) - (uint)(numValues % 5 == 0);
    uVar15 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar15 = 0;
    }
    for (uVar8 = 0; uVar8 != uVar15; uVar8 = uVar8 + 1) {
      bVar16 = input->isGivenInBlockForm;
      if (bVar16 == true) {
        local_88 = *(undefined8 *)((long)&input->value + uVar8 * 0x18 + 0x10);
        puVar1 = (undefined8 *)((long)&input->value + uVar8 * 0x18);
        local_98 = *puVar1;
        uStack_90 = puVar1[1];
      }
      else {
        local_98 = 0;
        uStack_90 = 0;
        local_88 = 0;
      }
      uVar2 = params->numBits;
      uVar10 = ~(-1 << ((byte)uVar2 & 0x1f));
      if (0x1f < uVar2) {
        uVar10 = 0xffffffff;
      }
      lVar11 = 5;
      if (uVar8 == uVar4 - 1) {
        lVar11 = (long)(int)((uVar4 - 1) * -5 + numValues);
      }
      for (lVar12 = 0; lVar12 != 5; lVar12 = lVar12 + 1) {
        if (lVar12 < lVar11) {
          if (bVar16 == false) {
            uVar3 = *(uint *)((long)&input->value +
                             lVar12 * 4 + ((long)(uVar8 * 0x500000000) >> 0x1e));
            uVar6 = uVar3 & uVar10;
            if ((int)uVar2 < 1) {
              uVar6 = 0;
            }
            local_b8[lVar12] = uVar6;
            dVar13 = uVar3 >> ((byte)uVar2 & 0x1f);
          }
          else {
            local_b8[lVar12] = *(deUint32 *)((long)&local_98 + lVar12 * 4 + 4);
            dVar13 = 0xffffffff;
          }
        }
        else {
          local_b8[lVar12] = 0;
          dVar13 = 0;
        }
        quintParts[lVar12] = dVar13;
      }
      puVar7 = (uint *)&local_98;
      if (bVar16 == false) {
        puVar7 = (uint *)((anonymous_namespace)::
                          encodeISETritBlock(tcu::astc::(anonymous_namespace)::BitAssignAccessStream&,int,bool,tcu::astc::(anonymous_namespace)::ISEInput::Block_const&,unsigned_int_const*,int)
                          ::tritBlockTValue +
                         (ulong)local_68 * 4 +
                         (ulong)local_6c * 0xc +
                         (ulong)quintParts[2] * 0x24 + (ulong)quintParts[1] * 0x6c +
                         (ulong)quintParts[0] * 0x144);
      }
      uVar10 = *puVar7;
      BitAssignAccessStream::setNext(dst,uVar2,local_b8[0]);
      BitAssignAccessStream::setNext(dst,2,uVar10 & 3);
      BitAssignAccessStream::setNext(dst,uVar2,local_b8[1]);
      BitAssignAccessStream::setNext(dst,2,uVar10 >> 2 & 3);
      BitAssignAccessStream::setNext(dst,uVar2,local_b8[2]);
      BitAssignAccessStream::setNext(dst,1,uVar10 >> 4 & 1);
      BitAssignAccessStream::setNext(dst,uVar2,local_b8[3]);
      BitAssignAccessStream::setNext(dst,2,uVar10 >> 5 & 3);
      BitAssignAccessStream::setNext(dst,uVar2,local_b8[4]);
      BitAssignAccessStream::setNext(dst,1,uVar10 >> 7 & 1);
    }
  }
  else if (params->mode == ISEMODE_QUINT) {
    uVar4 = (numValues / 3 + 1) - (uint)(numValues % 3 == 0);
    uVar15 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar15 = 0;
    }
    for (uVar8 = 0; uVar8 != uVar15; uVar8 = uVar8 + 1) {
      bVar16 = input->isGivenInBlockForm;
      if (bVar16 == true) {
        local_88 = *(undefined8 *)((long)&input->value + uVar8 * 0x18 + 0x10);
        puVar1 = (undefined8 *)((long)&input->value + uVar8 * 0x18);
        local_98 = *puVar1;
        uStack_90 = puVar1[1];
      }
      else {
        local_98 = 0;
        uStack_90 = 0;
        local_88 = 0;
      }
      uVar2 = params->numBits;
      uVar10 = ~(-1 << ((byte)uVar2 & 0x1f));
      if (0x1f < uVar2) {
        uVar10 = 0xffffffff;
      }
      lVar11 = 3;
      if (uVar8 == uVar4 - 1) {
        lVar11 = (long)(int)((uVar4 - 1) * -3 + numValues);
      }
      for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
        if (lVar12 < lVar11) {
          if (bVar16 == false) {
            uVar3 = *(uint *)((long)&input->value +
                             lVar12 * 4 + ((long)(uVar8 * 0x300000000) >> 0x1e));
            uVar6 = uVar3 & uVar10;
            if ((int)uVar2 < 1) {
              uVar6 = 0;
            }
            local_b8[lVar12] = uVar6;
            dVar13 = uVar3 >> ((byte)uVar2 & 0x1f);
          }
          else {
            local_b8[lVar12] = *(deUint32 *)((long)&local_98 + lVar12 * 4 + 4);
            dVar13 = 0xffffffff;
          }
        }
        else {
          local_b8[lVar12] = 0;
          dVar13 = 0;
        }
        quintParts[lVar12] = dVar13;
      }
      puVar7 = (uint *)((anonymous_namespace)::
                        encodeISEQuintBlock(tcu::astc::(anonymous_namespace)::BitAssignAccessStream&,int,bool,tcu::astc::(anonymous_namespace)::ISEInput::Block_const&,unsigned_int_const*,int)
                        ::quintBlockQValue +
                       (ulong)quintParts[2] * 4 +
                       (ulong)quintParts[1] * 0x14 + (ulong)quintParts[0] * 100);
      if (bVar16 != false) {
        puVar7 = (uint *)&local_98;
      }
      uVar10 = *puVar7;
      BitAssignAccessStream::setNext(dst,uVar2,local_b8[0]);
      BitAssignAccessStream::setNext(dst,3,uVar10 & 7);
      BitAssignAccessStream::setNext(dst,uVar2,local_b8[1]);
      BitAssignAccessStream::setNext(dst,2,uVar10 >> 3 & 3);
      BitAssignAccessStream::setNext(dst,uVar2,local_b8[2]);
      BitAssignAccessStream::setNext(dst,2,uVar10 >> 5 & 3);
    }
  }
  else {
    uVar15 = 0;
    if (0 < numValues) {
      uVar15 = (ulong)(uint)numValues;
    }
    paVar14 = (anon_union_1536_2_f6fb8abe_for_value *)((input->value).plain + 1);
    pIVar9 = input;
    while( true ) {
      pIVar9 = (ISEInput *)&pIVar9->value;
      bVar16 = uVar15 == 0;
      uVar15 = uVar15 - 1;
      if (bVar16) break;
      paVar5 = (anon_union_1536_2_f6fb8abe_for_value *)pIVar9;
      if (input->isGivenInBlockForm != false) {
        paVar5 = paVar14;
      }
      BitAssignAccessStream::setNext(dst,params->numBits,paVar5->plain[0]);
      paVar14 = (anon_union_1536_2_f6fb8abe_for_value *)(paVar14->plain + 6);
    }
  }
  return;
}

Assistant:

static void encodeISE (BitAssignAccessStream& dst, const ISEParams& params, const ISEInput& input, int numValues)
{
	if (params.mode == ISEMODE_TRIT)
	{
		const int numBlocks = deDivRoundUp32(numValues, 5);
		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			const int numValuesInBlock = blockNdx == numBlocks-1 ? numValues - 5*(numBlocks-1) : 5;
			encodeISETritBlock(dst, params.numBits, input.isGivenInBlockForm,
							   input.isGivenInBlockForm ? input.value.block[blockNdx]	: ISEInput::Block(),
							   input.isGivenInBlockForm ? DE_NULL						: &input.value.plain[5*blockNdx],
							   numValuesInBlock);
		}
	}
	else if (params.mode == ISEMODE_QUINT)
	{
		const int numBlocks = deDivRoundUp32(numValues, 3);
		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			const int numValuesInBlock = blockNdx == numBlocks-1 ? numValues - 3*(numBlocks-1) : 3;
			encodeISEQuintBlock(dst, params.numBits, input.isGivenInBlockForm,
								input.isGivenInBlockForm ? input.value.block[blockNdx]	: ISEInput::Block(),
								input.isGivenInBlockForm ? DE_NULL						: &input.value.plain[3*blockNdx],
								numValuesInBlock);
		}
	}
	else
	{
		DE_ASSERT(params.mode == ISEMODE_PLAIN_BIT);
		for (int i = 0; i < numValues; i++)
			encodeISEBitBlock(dst, params.numBits, input.isGivenInBlockForm ? input.value.block[i].bitValues[0] : input.value.plain[i]);
	}
}